

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__run_closing_handles(uv_loop_t *loop)

{
  uv_handle_t *puVar1;
  uv_handle_t *q;
  uv_handle_t *p;
  uv_loop_t *loop_local;
  
  q = loop->closing_handles;
  loop->closing_handles = (uv_handle_t *)0x0;
  while (q != (uv_handle_t *)0x0) {
    puVar1 = q->next_closing;
    uv__finish_close(q);
    q = puVar1;
  }
  return;
}

Assistant:

static void uv__run_closing_handles(uv_loop_t* loop) {
  uv_handle_t* p;
  uv_handle_t* q;

  p = loop->closing_handles;
  loop->closing_handles = NULL;

  while (p) {
    q = p->next_closing;
    uv__finish_close(p);
    p = q;
  }
}